

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_python.cc
# Opt level: O2

dict get_frame_local(uint32_t num_frame_back)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint in_ESI;
  undefined4 in_register_0000003c;
  object this;
  bool bVar4;
  handle local_28;
  handle obj;
  
  this.super_handle.m_ptr._4_4_ = in_register_0000003c;
  this.super_handle.m_ptr._0_4_ = num_frame_back;
  lVar1 = PyThreadState_Get();
  lVar1 = *(long *)(lVar1 + 0x18);
  uVar3 = 1;
  do {
    lVar2 = lVar1;
    if (*(long *)(lVar2 + 0x18) == 0) break;
    bVar4 = uVar3 < in_ESI;
    lVar1 = *(long *)(lVar2 + 0x18);
    uVar3 = uVar3 + 1;
  } while (bVar4);
  PyFrame_FastToLocals(lVar2);
  local_28.m_ptr = *(PyObject **)(lVar2 + 0x38);
  if (local_28.m_ptr == (PyObject *)0x0) {
    pybind11::dict::dict((dict *)this.super_handle.m_ptr);
  }
  else {
    pybind11::cast<pybind11::dict,_0>((pybind11 *)this.super_handle.m_ptr,&local_28);
  }
  return (dict)this.super_handle.m_ptr;
}

Assistant:

py::dict get_frame_local(uint32_t num_frame_back) {
    PyFrameObject *frame = PyThreadState_Get()->frame;
    uint32_t i = 0;
    while (frame->f_back && (++i) < num_frame_back) {
        frame = frame->f_back;
    }
    if (frame) {
        // implementation copied from
        // https://github.com/python/cpython/blob/master/Python/ceval.c
        // PyEval_GetLocals(void)
        PyFrame_FastToLocals(frame);
        auto local = frame->f_locals;
        if (local) {
            py::handle obj(local);
            return obj.cast<py::dict>();
        }
    }
    return py::dict();
}